

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_left_delim_join.cpp
# Opt level: O2

void __thiscall
duckdb::LeftDelimJoinGlobalState::Merge(LeftDelimJoinGlobalState *this,ColumnDataCollection *input)

{
  ::std::mutex::lock(&this->lhs_lock);
  ColumnDataCollection::Combine(&this->lhs_data,input);
  pthread_mutex_unlock((pthread_mutex_t *)&this->lhs_lock);
  return;
}

Assistant:

void Merge(ColumnDataCollection &input) {
		lock_guard<mutex> guard(lhs_lock);
		lhs_data.Combine(input);
	}